

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_recursive_cte.cpp
# Opt level: O2

SinkResultType __thiscall
duckdb::PhysicalRecursiveCTE::Sink
          (PhysicalRecursiveCTE *this,ExecutionContext *context,DataChunk *chunk,
          OperatorSinkInput *input)

{
  mutex *__mutex;
  RecursiveCTEState *state;
  Allocator *pAVar1;
  pointer this_00;
  idx_t iVar2;
  PhysicalRecursiveCTE *this_01;
  DataChunk payload_rows;
  DataChunk distinct_rows;
  
  state = (RecursiveCTEState *)input->global_state;
  __mutex = &state->intermediate_table_lock;
  this_01 = (PhysicalRecursiveCTE *)__mutex;
  ::std::mutex::lock(__mutex);
  if (this->using_key == false) {
    if (this->union_all == false) {
      iVar2 = ProbeHT(this_01,chunk,state);
      if (iVar2 != 0) {
        ColumnDataCollection::Append(&state->intermediate_table,chunk);
      }
    }
    else {
      ColumnDataCollection::Append(&state->intermediate_table,chunk);
    }
  }
  else {
    DataChunk::DataChunk(&distinct_rows);
    pAVar1 = Allocator::DefaultAllocator();
    DataChunk::Initialize(&distinct_rows,pAVar1,&this->distinct_types,0x800);
    PopulateChunk(&distinct_rows,chunk,&this->distinct_idx,true);
    DataChunk::DataChunk(&payload_rows);
    if ((this->payload_types).
        super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
        super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (this->payload_types).
        super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
        super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pAVar1 = Allocator::DefaultAllocator();
      DataChunk::Initialize(&payload_rows,pAVar1,&this->payload_types,0x800);
    }
    PopulateChunk(&payload_rows,chunk,&this->payload_idx,true);
    this_00 = unique_ptr<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>,_true>
              ::operator->(&state->ht);
    GroupedAggregateHashTable::AddChunk(this_00,&distinct_rows,&payload_rows,NON_DISTINCT);
    ColumnDataCollection::Append(&state->intermediate_table,chunk);
    DataChunk::~DataChunk(&payload_rows);
    DataChunk::~DataChunk(&distinct_rows);
  }
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return NEED_MORE_INPUT;
}

Assistant:

SinkResultType PhysicalRecursiveCTE::Sink(ExecutionContext &context, DataChunk &chunk, OperatorSinkInput &input) const {
	auto &gstate = input.global_state.Cast<RecursiveCTEState>();

	lock_guard<mutex> guard(gstate.intermediate_table_lock);
	if (!using_key) {
		if (!union_all) {
			idx_t match_count = ProbeHT(chunk, gstate);
			if (match_count > 0) {
				gstate.intermediate_table.Append(chunk);
			}
		} else {
			gstate.intermediate_table.Append(chunk);
		}
	} else {
		// Split incoming DataChunk into payload and keys
		DataChunk distinct_rows;
		distinct_rows.Initialize(Allocator::DefaultAllocator(), distinct_types);
		PopulateChunk(distinct_rows, chunk, distinct_idx, true);
		DataChunk payload_rows;
		if (!payload_types.empty()) {
			payload_rows.Initialize(Allocator::DefaultAllocator(), payload_types);
		}
		PopulateChunk(payload_rows, chunk, payload_idx, true);

		// Add the chunk to the hash table and append it to the intermediate table
		gstate.ht->AddChunk(distinct_rows, payload_rows, AggregateType::NON_DISTINCT);
		gstate.intermediate_table.Append(chunk);
	}

	return SinkResultType::NEED_MORE_INPUT;
}